

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O0

RK_S32 get_next_nal(RK_U8 *buf,RK_S32 *length)

{
  bool bVar1;
  long lVar2;
  uint local_34;
  RK_S32 has_nal;
  RK_U32 state;
  RK_U8 *tmp_buf;
  int local_20;
  RK_S32 len;
  RK_S32 consumed;
  RK_S32 i;
  RK_S32 *length_local;
  RK_U8 *buf_local;
  
  local_20 = 0;
  tmp_buf._4_4_ = *length;
  _has_nal = buf;
  while (3 < tmp_buf._4_4_) {
    if (_has_nal[2] == '\0') {
      tmp_buf._4_4_ = tmp_buf._4_4_ + -1;
      _has_nal = _has_nal + 1;
    }
    else {
      if (((*_has_nal != '\0') || (_has_nal[1] != '\0')) || (_has_nal[2] != '\x01')) {
        local_34 = 0xffffffff;
        bVar1 = false;
        len = 0;
        goto LAB_002f7781;
      }
      _has_nal = _has_nal + 3;
      tmp_buf._4_4_ = tmp_buf._4_4_ + -3;
    }
  }
LAB_002f7827:
  *length = *length - local_20;
  return local_20;
LAB_002f7781:
  if (tmp_buf._4_4_ <= len) goto LAB_002f77cf;
  lVar2 = (long)len;
  if ((local_34 & 0xffffff) == 1) {
    bVar1 = true;
    len = len + -3;
    goto LAB_002f77cf;
  }
  len = len + 1;
  local_34 = local_34 << 8 | (uint)_has_nal[lVar2];
  goto LAB_002f7781;
LAB_002f77cf:
  if (bVar1) {
    local_20 = (*length - (tmp_buf._4_4_ - len)) + -1;
  }
  else {
    local_20 = *length;
  }
  goto LAB_002f7827;
}

Assistant:

static RK_S32 get_next_nal(RK_U8 *buf, RK_S32 *length)
{
    RK_S32 i, consumed = 0;
    RK_S32 len = *length;
    RK_U8 *tmp_buf = buf;

    /* search start code */
    while (len >= 4) {
        if (tmp_buf[2] == 0) {
            len--;
            tmp_buf++;
            continue;
        }

        if (tmp_buf[0] != 0 || tmp_buf[1] != 0 || tmp_buf[2] != 1) {
            RK_U32 state = (RK_U32) - 1;
            RK_S32 has_nal = 0;

            for (i = 0; i < (RK_S32)len; i++) {
                state = (state << 8) | tmp_buf[i];
                if (((state >> 8) & 0xFFFFFF) == START_CODE) {
                    has_nal = 1;
                    i = i - 3;
                    break;
                }
            }

            if (has_nal) {
                len -= i;
                tmp_buf += i;
                consumed = *length - len - 1;
                break;
            }

            consumed = *length;
            break;
        }
        tmp_buf   += 3;
        len       -= 3;
    }

    *length = *length - consumed;
    return consumed;
}